

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O2

ON_3dPoint * __thiscall
ON_OffsetSurfaceFunction::PointAt
          (ON_3dPoint *__return_storage_ptr__,ON_OffsetSurfaceFunction *this,double s,double t)

{
  double dVar1;
  bool bVar2;
  ON_3dVector N;
  ON_3dVector local_68;
  ON_3dVector local_48;
  ON_3dPoint local_30;
  
  __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
  dVar1 = ON_3dPoint::NanPoint.y;
  __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
  __return_storage_ptr__->y = dVar1;
  local_68.z = ON_3dVector::NanVector.z;
  local_68.x = ON_3dVector::NanVector.x;
  local_68.y = ON_3dVector::NanVector.y;
  if (this->m_srf != (ON_Surface *)0x0) {
    bVar2 = ON_Surface::EvNormal(this->m_srf,s,t,__return_storage_ptr__,&local_68,0,(int *)0x0);
    if (bVar2) {
      dVar1 = DistanceAt(this,s,t);
      ::operator*(&local_48,dVar1,&local_68);
      ON_3dPoint::operator+(&local_30,__return_storage_ptr__,&local_48);
      __return_storage_ptr__->z = local_30.z;
      __return_storage_ptr__->x = local_30.x;
      __return_storage_ptr__->y = local_30.y;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_OffsetSurfaceFunction::PointAt(
  double s,
  double t
  ) const
{
  //double d = 0.0;
  ON_3dPoint P(ON_3dPoint::NanPoint);
  ON_3dVector N(ON_3dVector::NanVector);
  if ( 0 != m_srf )
  {
    if ( m_srf->EvNormal(s,t,P,N) )
    {
      P = P + DistanceAt(s,t)*N;
    }
  }
  return P;
}